

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode
JsGetModuleHostInfo(JsModuleRecord requestModule,JsModuleHostInfoKind moduleHostInfo,void **hostInfo
                   )

{
  ScriptContext *scriptContext;
  bool bVar1;
  SourceTextModuleRecord *pSVar2;
  JsrtContext *pJVar3;
  JsrtContext *context;
  long lVar4;
  void *pvVar5;
  JsErrorCode JVar6;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 local_a0 [8];
  EnterScriptObject __enterScriptObject;
  TTDebuggerAbortException anon_var_0;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (requestModule == (JsModuleRecord)0x0) {
    return JsErrorInvalidArgument;
  }
  if (hostInfo == (void **)0x0) {
    return JsErrorInvalidArgument;
  }
  if (*(int *)((long)requestModule + 8) != 0x65646f4d) {
    return JsErrorInvalidArgument;
  }
  *hostInfo = (void *)0x0;
  pSVar2 = Js::SourceTextModuleRecord::FromHost(requestModule);
  pJVar3 = (JsrtContext *)
           Js::JavascriptLibrary::GetJsrtContext
                     ((((pSVar2->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary);
  context = JsrtContext::GetCurrent();
  scriptContext = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                      ExceptionType_OutOfMemory);
  bVar1 = JsrtContext::TrySetCurrent(pJVar3);
  JVar6 = JsErrorWrongThread;
  if (!bVar1) goto LAB_003bde74;
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_a0,scriptContext,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_a0);
  pJVar3 = JsrtContext::GetCurrent();
  switch(moduleHostInfo) {
  case JsModuleHostInfo_Exception:
    pvVar5 = (pSVar2->errorObject).ptr;
    if (pvVar5 != (void *)0x0) goto LAB_003bde63;
    goto LAB_003bde66;
  case JsModuleHostInfo_HostDefined:
    lVar4 = 0xd0;
    break;
  case JsModuleHostInfo_NotifyModuleReadyCallback:
    pSVar2 = (SourceTextModuleRecord *)
             pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject;
    lVar4 = 0x20;
    break;
  case JsModuleHostInfo_FetchImportedModuleCallback:
    pSVar2 = (SourceTextModuleRecord *)
             pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject;
    lVar4 = 0x10;
    break;
  case JsModuleHostInfo_FetchImportedModuleFromScriptCallback:
    pSVar2 = (SourceTextModuleRecord *)
             pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject;
    lVar4 = 0x18;
    break;
  case JsModuleHostInfo_Url:
    lVar4 = 0xd8;
    break;
  case JsModuleHostInfo_InitializeImportMetaCallback:
    pSVar2 = (SourceTextModuleRecord *)
             pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject;
    lVar4 = 0x28;
    break;
  case JsModuleHostInfo_ReportModuleCompletionCallback:
    pSVar2 = (SourceTextModuleRecord *)
             pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject;
    lVar4 = 0x30;
    break;
  default:
    JVar6 = JsInvalidModuleHostInfoKind;
    goto LAB_003bde68;
  }
  pvVar5 = *(void **)((long)&(pSVar2->super_ModuleRecordBase).super_FinalizableObject.
                             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar4);
LAB_003bde63:
  *hostInfo = pvVar5;
LAB_003bde66:
  JVar6 = JsNoError;
LAB_003bde68:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_a0);
LAB_003bde74:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&__enterScriptObject.library,
             ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  JsrtContext::TrySetCurrent(context);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&__enterScriptObject.library);
  return JVar6;
}

Assistant:

CHAKRA_API
JsGetModuleHostInfo(
    _In_  JsModuleRecord requestModule,
    _In_ JsModuleHostInfoKind moduleHostInfo,
    _Outptr_result_maybenull_ void** hostInfo)
{
    if (!Js::SourceTextModuleRecord::Is(requestModule) || (hostInfo == nullptr))
    {
        return JsErrorInvalidArgument;
    }
    *hostInfo = nullptr;
    Js::SourceTextModuleRecord* moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
    Js::ScriptContext* scriptContext = moduleRecord->GetScriptContext();
    JsrtContext* jsrtContext = (JsrtContext*)scriptContext->GetLibrary()->GetJsrtContext();
    JsErrorCode errorCode = SetContextAPIWrapper(jsrtContext, [&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        JsrtContextCore* currentContext = static_cast<JsrtContextCore*>(JsrtContextCore::GetCurrent());
        switch (moduleHostInfo)
        {
        case JsModuleHostInfo_Exception:
            if (moduleRecord->GetErrorObject() != nullptr)
            {
                *hostInfo = moduleRecord->GetErrorObject();
            }
            break;
        case JsModuleHostInfo_HostDefined:
            *hostInfo = moduleRecord->GetHostDefined();
            break;
        case JsModuleHostInfo_FetchImportedModuleCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetFetchImportedModuleCallback());
            break;
        case JsModuleHostInfo_FetchImportedModuleFromScriptCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetFetchImportedModuleFromScriptCallback());
            break;
        case JsModuleHostInfo_NotifyModuleReadyCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetNotifyModuleReadyCallback());
            break;
        case JsModuleHostInfo_InitializeImportMetaCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetInitializeImportMetaCallback());
            break;
        case JsModuleHostInfo_ReportModuleCompletionCallback:
            *hostInfo = reinterpret_cast<void*>(currentContext->GetHostScriptContext()->GetReportModuleCompletionCallback());
            break;
        case JsModuleHostInfo_Url:
            *hostInfo = reinterpret_cast<void*>(moduleRecord->GetSpecifier());
            break;
        default:
            return JsInvalidModuleHostInfoKind;
        };
        return JsNoError;
    });
    return errorCode;
}